

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

int __thiscall
MlmWrap::receiveMailbox(MlmWrap *this,char *sender,char *subject,char *format,TrodesMsg *msg)

{
  int iVar1;
  
  iVar1 = strcmp(subject,"cmd");
  if (iVar1 == 0) {
    iVar1 = processMlmCommandMsg(this,msg);
    return iVar1;
  }
  iVar1 = strcmp(subject,"info_rep");
  if (iVar1 == 0) {
    iVar1 = processMlmReplyMsg(this,msg);
    return iVar1;
  }
  iVar1 = strcmp(subject,"info_req");
  if (iVar1 == 0) {
    iVar1 = processMlmRequestMsg(this,sender,msg);
    return iVar1;
  }
  iVar1 = strcmp(subject,"network_note");
  if (iVar1 != 0) {
    iVar1 = (*this->_vptr_MlmWrap[7])(this,sender,subject,msg);
    return iVar1;
  }
  iVar1 = processMlmNetworkNotification(this,sender,msg);
  return iVar1;
}

Assistant:

int MlmWrap::receiveMailbox(const char *sender, const char *subject, const char *format, TrodesMsg &msg) {
    int rc = 0;
    if (streq(subject, TRODES_CMD)) { //direct message commands
        rc = processMlmCommandMsg(msg);
    }
    else if (streq(subject, TRODES_INFO_REP)) { //mlm processes reply messages in a standardized way
        rc = processMlmReplyMsg(msg);
    }
    else if (streq(subject,TRODES_INFO_REQ)) { //mlm processes request messages in a standardized way
        rc = processMlmRequestMsg(sender, msg);
    }
    else if (streq(subject,TRODES_NETWORK_NOTIFICATION)) { //mlm processes internal network notifications
        rc = processMlmNetworkNotification(sender, msg);
    }
    else{
        rc = processOtherMsg(sender, subject, msg); //if the type is unknown, send it to the processOtherMsg function
    }
    return(rc);
}